

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O1

idx_t duckdb::TimeToStringCast::MicrosLength(int32_t micros,char *micro_buffer)

{
  int32_t val;
  unsigned_long uVar1;
  
  if (micros != 0) {
    val = FormatMicros(micros,micro_buffer);
    uVar1 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
    return 0xf - uVar1;
  }
  return 8;
}

Assistant:

static idx_t MicrosLength(int32_t micros, char micro_buffer[]) {
		// format is HH:MM:DD.MS
		// microseconds come after the time with a period separator
		idx_t length;
		if (micros == 0) {
			// no microseconds
			// format is HH:MM:DD
			length = 8;
		} else {
			length = 15;
			// for microseconds, we truncate any trailing zeros (i.e. "90000" becomes ".9")
			// first write the microseconds to the microsecond buffer
			// we write backwards and pad with zeros to the left
			// now we figure out how many digits we need to include by looking backwards
			// and checking how many zeros we encounter
			length -= NumericCast<idx_t>(FormatMicros(micros, micro_buffer));
		}
		return length;
	}